

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::ConvertMaterial(LWOImporter *this,Surface *surf,aiMaterial *pcMat)

{
  bool bVar1;
  Logger *pLVar2;
  basic_formatter *this_00;
  double dVar3;
  bool local_639;
  aiColor3D local_62c;
  ai_real local_620 [2];
  int m_;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  string local_498;
  reference local_478;
  Shader *shader;
  const_iterator __end1;
  const_iterator __begin1;
  ShaderList *__range1;
  int iStack_450;
  bool b;
  float f;
  int def;
  int add;
  undefined1 local_43c [8];
  aiColor3D clr;
  float fGloss;
  aiShadingMode m;
  int i;
  aiString st;
  aiMaterial *pcMat_local;
  Surface *surf_local;
  LWOImporter *this_local;
  
  st.data._1016_8_ = pcMat;
  aiString::aiString((aiString *)&m);
  aiString::Set((aiString *)&m,&surf->mName);
  aiMaterial::AddProperty((aiMaterial *)st.data._1016_8_,(aiString *)&m,"?mat.name",0,0);
  fGloss = (float)(uint)((surf->bDoubleSided & 1U) != 0);
  aiMaterial::AddProperty((aiMaterial *)st.data._1016_8_,(int *)&fGloss,1,"$mat.twosided",0,0);
  aiMaterial::AddProperty((aiMaterial *)st.data._1016_8_,&surf->mIOR,1,"$mat.refracti",0,0);
  aiMaterial::AddProperty
            ((aiMaterial *)st.data._1016_8_,&surf->mBumpIntensity,1,"$mat.bumpscaling",0,0);
  if (((surf->mSpecularValue == 0.0) && (!NAN(surf->mSpecularValue))) ||
     ((surf->mGlossiness == 0.0 && (!NAN(surf->mGlossiness))))) {
    clr.b = 2.8026e-45;
  }
  else {
    if ((this->mIsLWO2 & 1U) == 0) {
      if (16.0 < surf->mGlossiness) {
        if (64.0 < surf->mGlossiness) {
          if (256.0 < surf->mGlossiness) {
            clr.g = 80.0;
          }
          else {
            clr.g = 50.0;
          }
        }
        else {
          clr.g = 20.0;
        }
      }
      else {
        clr.g = 6.0;
      }
    }
    else {
      dVar3 = std::pow((double)(ulong)(uint)(surf->mGlossiness * 10.0 + 2.0),5.30498947741318e-315);
      clr.g = SUB84(dVar3,0);
    }
    aiMaterial::AddProperty
              ((aiMaterial *)st.data._1016_8_,&surf->mSpecularValue,1,"$mat.shinpercent",0,0);
    aiMaterial::AddProperty((aiMaterial *)st.data._1016_8_,&clr.g,1,"$mat.shininess",0,0);
    clr.b = 4.2039e-45;
  }
  aiColor3D::aiColor3D((aiColor3D *)&def,1.0,1.0,1.0);
  lerp<aiColor3D>((aiColor3D *)local_43c,(aiColor3D *)&def,surf->mColorHighlights);
  aiMaterial::AddProperty
            ((aiMaterial *)st.data._1016_8_,(aiColor3D *)local_43c,1,"$clr.specular",0,0);
  aiMaterial::AddProperty
            ((aiMaterial *)st.data._1016_8_,&surf->mSpecularValue,1,"$mat.shinpercent",0,0);
  local_43c._0_4_ = surf->mLuminosity * 0.8;
  local_43c._4_4_ = local_43c._0_4_;
  clr.r = (ai_real)local_43c._0_4_;
  aiMaterial::AddProperty<aiColor3D>
            ((aiMaterial *)st.data._1016_8_,(aiColor3D *)local_43c,1,"$clr.emissive",0,0);
  if ((surf->mAdditiveTransparency != 0.0) || (NAN(surf->mAdditiveTransparency))) {
    f = 1.4013e-45;
    aiMaterial::AddProperty
              ((aiMaterial *)st.data._1016_8_,&surf->mAdditiveTransparency,1,"$mat.opacity",0,0);
    aiMaterial::AddProperty((aiMaterial *)st.data._1016_8_,(int *)&f,1,"$mat.blend",0,0);
  }
  else if ((surf->mTransparency != 1e+11) || (NAN(surf->mTransparency))) {
    iStack_450 = 0;
    __range1._4_4_ = 1.0 - surf->mTransparency;
    aiMaterial::AddProperty
              ((aiMaterial *)st.data._1016_8_,(float *)((long)&__range1 + 4),1,"$mat.opacity",0,0);
    aiMaterial::AddProperty
              ((aiMaterial *)st.data._1016_8_,&stack0xfffffffffffffbb0,1,"$mat.blend",0,0);
  }
  __range1._3_1_ =
       HandleTextures(this,(aiMaterial *)st.data._1016_8_,&surf->mColorTextures,
                      aiTextureType_DIFFUSE);
  local_639 = true;
  if (!(bool)__range1._3_1_) {
    local_639 = HandleTextures(this,(aiMaterial *)st.data._1016_8_,&surf->mDiffuseTextures,
                               aiTextureType_DIFFUSE);
  }
  __range1._3_1_ = local_639;
  HandleTextures(this,(aiMaterial *)st.data._1016_8_,&surf->mSpecularTextures,aiTextureType_SPECULAR
                );
  HandleTextures(this,(aiMaterial *)st.data._1016_8_,&surf->mGlossinessTextures,
                 aiTextureType_SHININESS);
  HandleTextures(this,(aiMaterial *)st.data._1016_8_,&surf->mBumpTextures,aiTextureType_HEIGHT);
  HandleTextures(this,(aiMaterial *)st.data._1016_8_,&surf->mOpacityTextures,aiTextureType_OPACITY);
  HandleTextures(this,(aiMaterial *)st.data._1016_8_,&surf->mReflectionTextures,
                 aiTextureType_REFLECTION);
  __end1 = std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::begin
                     (&surf->mShaders);
  shader = (Shader *)
           std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::end
                     (&surf->mShaders);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&shader);
    if (!bVar1) {
LAB_006d8cda:
      if (surf->mMaximumSmoothAngle <= 0.0) {
        clr.b = 1.4013e-45;
      }
      local_620[0] = clr.b;
      aiMaterial::AddProperty((aiMaterial *)st.data._1016_8_,(int *)local_620,1,"$mat.shadingm",0,0)
      ;
      aiColor3D::aiColor3D(&local_62c,&surf->mColor);
      aiColor3D::operator=((aiColor3D *)local_43c,&local_62c);
      local_43c._0_4_ = surf->mDiffuseValue * (float)local_43c._0_4_;
      local_43c._4_4_ = surf->mDiffuseValue * (float)local_43c._4_4_;
      clr.r = surf->mDiffuseValue * clr.r;
      aiMaterial::AddProperty<aiColor3D>
                ((aiMaterial *)st.data._1016_8_,(aiColor3D *)local_43c,1,"$clr.diffuse",0,0);
      return;
    }
    local_478 = std::_List_const_iterator<Assimp::LWO::Shader>::operator*(&__end1);
    bVar1 = std::operator==(&local_478->functionName,"LW_SuperCelShader");
    if ((bVar1) || (bVar1 = std::operator==(&local_478->functionName,"AH_CelShader"), bVar1)) {
      pLVar2 = DefaultLogger::get();
      Logger::info(pLVar2,"LWO2: Mapping LW_SuperCelShader/AH_CelShader to aiShadingMode_Toon");
      clr.b = 7.00649e-45;
      goto LAB_006d8cda;
    }
    bVar1 = std::operator==(&local_478->functionName,"LW_RealFresnel");
    if ((bVar1) || (bVar1 = std::operator==(&local_478->functionName,"LW_FastFresnel"), bVar1)) {
      pLVar2 = DefaultLogger::get();
      Logger::info(pLVar2,"LWO2: Mapping LW_RealFresnel/LW_FastFresnel to aiShadingMode_Fresnel");
      clr.b = 1.4013e-44;
      goto LAB_006d8cda;
    }
    pLVar2 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[31]>(&local_610,(char (*) [31])"LWO2: Unknown surface shader: ");
    this_00 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_610,&local_478->functionName);
    Formatter::basic_formatter::operator_cast_to_string(&local_498,this_00);
    Logger::warn(pLVar2,&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_610);
    std::_List_const_iterator<Assimp::LWO::Shader>::operator++(&__end1);
  } while( true );
}

Assistant:

void LWOImporter::ConvertMaterial(const LWO::Surface& surf,aiMaterial* pcMat)
{
    // copy the name of the surface
    aiString st;
    st.Set(surf.mName);
    pcMat->AddProperty(&st,AI_MATKEY_NAME);

    const int i = surf.bDoubleSided ? 1 : 0;
    pcMat->AddProperty(&i,1,AI_MATKEY_TWOSIDED);

    // add the refraction index and the bump intensity
    pcMat->AddProperty(&surf.mIOR,1,AI_MATKEY_REFRACTI);
    pcMat->AddProperty(&surf.mBumpIntensity,1,AI_MATKEY_BUMPSCALING);

    aiShadingMode m;
    if (surf.mSpecularValue && surf.mGlossiness)
    {
        float fGloss;
        if (mIsLWO2)    {
            fGloss = std::pow( surf.mGlossiness*ai_real( 10.0 )+ ai_real( 2.0 ), ai_real( 2.0 ) );
        }
        else
        {
            if (16.0 >= surf.mGlossiness)
                fGloss = 6.0;
            else if (64.0 >= surf.mGlossiness)
                fGloss = 20.0;
            else if (256.0 >= surf.mGlossiness)
                fGloss = 50.0;
            else fGloss = 80.0;
        }

        pcMat->AddProperty(&surf.mSpecularValue,1,AI_MATKEY_SHININESS_STRENGTH);
        pcMat->AddProperty(&fGloss,1,AI_MATKEY_SHININESS);
        m = aiShadingMode_Phong;
    }
    else m = aiShadingMode_Gouraud;

    // specular color
    aiColor3D clr = lerp( aiColor3D(1.0,1.0,1.0), surf.mColor, surf.mColorHighlights );
    pcMat->AddProperty(&clr,1,AI_MATKEY_COLOR_SPECULAR);
    pcMat->AddProperty(&surf.mSpecularValue,1,AI_MATKEY_SHININESS_STRENGTH);

    // emissive color
    // luminosity is not really the same but it affects the surface in a similar way. Some scaling looks good.
    clr.g = clr.b = clr.r = surf.mLuminosity*ai_real( 0.8 );
    pcMat->AddProperty<aiColor3D>(&clr,1,AI_MATKEY_COLOR_EMISSIVE);

    // opacity ... either additive or default-blended, please
    if (0.0 != surf.mAdditiveTransparency)  {
        const int add = aiBlendMode_Additive;
        pcMat->AddProperty(&surf.mAdditiveTransparency,1,AI_MATKEY_OPACITY);
        pcMat->AddProperty(&add,1,AI_MATKEY_BLEND_FUNC);
    } else if (10e10f != surf.mTransparency)  {
        const int def = aiBlendMode_Default;
        const float f = 1.0f-surf.mTransparency;
        pcMat->AddProperty(&f,1,AI_MATKEY_OPACITY);
        pcMat->AddProperty(&def,1,AI_MATKEY_BLEND_FUNC);
    }


    // ADD TEXTURES to the material
    // TODO: find out how we can handle COLOR textures correctly...
    bool b = HandleTextures(pcMat,surf.mColorTextures,aiTextureType_DIFFUSE);
    b = (b || HandleTextures(pcMat,surf.mDiffuseTextures,aiTextureType_DIFFUSE));
    HandleTextures(pcMat,surf.mSpecularTextures,aiTextureType_SPECULAR);
    HandleTextures(pcMat,surf.mGlossinessTextures,aiTextureType_SHININESS);
    HandleTextures(pcMat,surf.mBumpTextures,aiTextureType_HEIGHT);
    HandleTextures(pcMat,surf.mOpacityTextures,aiTextureType_OPACITY);
    HandleTextures(pcMat,surf.mReflectionTextures,aiTextureType_REFLECTION);

    // Now we need to know which shader to use .. iterate through the shader list of
    // the surface and  search for a name which we know ...
    for (const auto &shader : surf.mShaders)   {
        if (shader.functionName == "LW_SuperCelShader" || shader.functionName == "AH_CelShader")  {
            ASSIMP_LOG_INFO("LWO2: Mapping LW_SuperCelShader/AH_CelShader to aiShadingMode_Toon");

            m = aiShadingMode_Toon;
            break;
        }
        else if (shader.functionName == "LW_RealFresnel" || shader.functionName == "LW_FastFresnel")  {
            ASSIMP_LOG_INFO("LWO2: Mapping LW_RealFresnel/LW_FastFresnel to aiShadingMode_Fresnel");

            m = aiShadingMode_Fresnel;
            break;
        }
        else
        {
            ASSIMP_LOG_WARN_F("LWO2: Unknown surface shader: ", shader.functionName);
        }
    }
    if (surf.mMaximumSmoothAngle <= 0.0)
        m = aiShadingMode_Flat;
    int m_ = static_cast<int>(m);
    pcMat->AddProperty(&m_, 1, AI_MATKEY_SHADING_MODEL);

    // (the diffuse value is just a scaling factor)
    // If a diffuse texture is set, we set this value to 1.0
    clr = (b && false ? aiColor3D(1.0,1.0,1.0) : surf.mColor);
    clr.r *= surf.mDiffuseValue;
    clr.g *= surf.mDiffuseValue;
    clr.b *= surf.mDiffuseValue;
    pcMat->AddProperty<aiColor3D>(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
}